

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_ports_linux.cc
# Opt level: O3

char * dirname(char *__path)

{
  ulong uVar1;
  char *extraout_RAX;
  char *extraout_RAX_00;
  char *pcVar2;
  string *in_RSI;
  
  uVar1 = std::__cxx11::string::rfind((char *)in_RSI,0x10da09,0xffffffffffffffff);
  if (uVar1 == 0) {
    *(char **)__path = __path + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)__path,"/","");
    return extraout_RAX_00;
  }
  if (uVar1 == 0xffffffffffffffff) {
    *(char **)__path = __path + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__path,*(long *)in_RSI,*(long *)(in_RSI + 8) + *(long *)in_RSI);
    return extraout_RAX;
  }
  pcVar2 = (char *)std::__cxx11::string::string((string *)__path,in_RSI,0,uVar1);
  return pcVar2;
}

Assistant:

string
dirname(const string& path)
{
    size_t pos = path.rfind("/");

    if(pos == std::string::npos)
        return path;
    else if(pos == 0)
        return "/";

    return string(path, 0, pos);
}